

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O3

QPDF_ERROR_CODE qpdf_init_write_memory(qpdf_data qpdf)

{
  QPDF_ERROR_CODE QVar1;
  function<void_(_qpdf_data_*)> local_30;
  
  qpdf_init_write_internal(qpdf);
  local_30.super__Function_base._M_functor._8_8_ = 0;
  local_30.super__Function_base._M_functor._M_unused._M_object = call_init_write_memory;
  local_30._M_invoker =
       std::_Function_handler<void_(_qpdf_data_*),_void_(*)(_qpdf_data_*)>::_M_invoke;
  local_30.super__Function_base._M_manager =
       std::_Function_handler<void_(_qpdf_data_*),_void_(*)(_qpdf_data_*)>::_M_manager;
  QVar1 = trap_errors(qpdf,&local_30);
  if (local_30.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_30.super__Function_base._M_manager)
              ((_Any_data *)&local_30,(_Any_data *)&local_30,__destroy_functor);
  }
  qpdf->write_memory = true;
  return QVar1;
}

Assistant:

QPDF_ERROR_CODE
qpdf_init_write_memory(qpdf_data qpdf)
{
    qpdf_init_write_internal(qpdf);
    QPDF_ERROR_CODE status = trap_errors(qpdf, &call_init_write_memory);
    QTC::TC("qpdf", "qpdf-c called qpdf_init_write_memory");
    qpdf->write_memory = true;
    return status;
}